

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::ParseStream<272u,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  undefined8 uVar1;
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *pGVar2;
  runtime_error *this_00;
  ParseResult PVar3;
  ClearStackOnExit scope;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> reader;
  ClearStackOnExit local_68;
  Stack<rapidjson::CrtAllocator> local_60;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  
  if (*(long *)(this + 0x20) == 0) {
    local_60.allocator_ = (CrtAllocator *)0x0;
  }
  else {
    local_60.allocator_ =
         internal::Stack<rapidjson::CrtAllocator>::GetAllocator
                   ((Stack<rapidjson::CrtAllocator> *)(this + 0x20));
  }
  local_60.ownAllocator_ = (CrtAllocator *)0x0;
  local_60.stack_ = (char *)0x0;
  local_60.stackTop_ = (char *)0x0;
  local_60.stackEnd_ = (char *)0x0;
  local_60.initialCapacity_ = 0x100;
  local_30 = 0;
  local_28 = 0;
  local_20 = 2;
  local_68.d_ = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 *)this;
  PVar3 = GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<272u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&local_60,is,
                     (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this);
  *(ParseErrorCode *)(this + 0x50) = PVar3.code_;
  *(size_t *)(this + 0x58) = PVar3.offset_;
  if (PVar3.code_ == kParseErrorNone) {
    if (*(long *)(this + 0x38) - *(long *)(this + 0x30) != 0x10) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "rapidjson internal assertion failure: stack_.GetSize() == sizeof(ValueType)");
      *(undefined ***)this_00 = &PTR__runtime_error_001da248;
      __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
    }
    pGVar2 = (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)internal::Stack<rapidjson::CrtAllocator>::
                Pop<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          ((Stack<rapidjson::CrtAllocator> *)(this + 0x20),1);
    if (pGVar2 != this) {
      uVar1 = *(undefined8 *)(pGVar2 + 8);
      *(undefined8 *)this = *(undefined8 *)pGVar2;
      *(undefined8 *)(this + 8) = uVar1;
      *(undefined2 *)(pGVar2 + 0xe) = 0;
    }
  }
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::~ClearStackOnExit(&local_68);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_60);
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& ParseStream(InputStream& is) {
        GenericReader<SourceEncoding, Encoding, StackAllocator> reader(
            stack_.HasAllocator() ? &stack_.GetAllocator() : 0);
        ClearStackOnExit scope(*this);
        parseResult_ = reader.template Parse<parseFlags>(is, *this);
        if (parseResult_) {
            CEREAL_RAPIDJSON_ASSERT(stack_.GetSize() == sizeof(ValueType)); // Got one and only one root object
            ValueType::operator=(*stack_.template Pop<ValueType>(1));// Move value from stack to document
        }
        return *this;
    }